

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.hpp
# Opt level: O3

void __thiscall
mio::basic_mmap<(mio::access_mode)0,char>::map<std::__cxx11::string>
          (basic_mmap<(mio::access_mode)0,char> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path,size_type offset,
          size_type length,error_code *error)

{
  error_category *peVar1;
  file_handle_type handle;
  
  peVar1 = (error_category *)std::_V2::system_category();
  error->_M_value = 0;
  error->_M_cat = peVar1;
  if (path->_M_string_length == 0) {
    peVar1 = (error_category *)std::_V2::generic_category();
    error->_M_value = 0x16;
    error->_M_cat = peVar1;
  }
  else {
    handle = detail::open_file<std::__cxx11::string>(path,read,error);
    if (error->_M_value == 0) {
      basic_mmap<(mio::access_mode)0,_char>::map
                ((basic_mmap<(mio::access_mode)0,_char> *)this,handle,offset,length,error);
      if (error->_M_value == 0) {
        this[0x1c] = (basic_mmap<(mio::access_mode)0,char>)0x1;
      }
    }
  }
  return;
}

Assistant:

void basic_mmap<AccessMode, ByteT>::map(const String& path, const size_type offset,
        const size_type length, std::error_code& error)
{
    error.clear();
    if(detail::empty(path))
    {
        error = std::make_error_code(std::errc::invalid_argument);
        return;
    }
    const auto handle = detail::open_file(path, AccessMode, error);
    if(error)
    {
        return;
    }

    map(handle, offset, length, error);
    // This MUST be after the call to map, as that sets this to true.
    if(!error)
    {
        is_handle_internal_ = true;
    }
}